

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation_test.cc
# Opt level: O2

void __thiscall
DebugAllocationTest_StompAfter_Test::TestBody(DebugAllocationTest_StompAfter_Test *this)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  bool bVar2;
  int iVar3;
  char *message;
  DeathTest DVar4;
  char *regex;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var5;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60 [4];
  ReturnSentinel local_40;
  ReturnSentinel gtest_sentinel;
  DeathTest *gtest_dt;
  
  local_60[0]._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(4);
  (*noopt_helper)(local_60);
  _Var1._M_head_impl = local_60[0]._M_head_impl;
  *(undefined4 *)(local_60[0]._M_head_impl + 4) = 5;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_78,(internal *)"a word after object",regex);
    bVar2 = testing::internal::DeathTest::Create
                      ("delete pint",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_78,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x83,&gtest_sentinel.test_);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_78);
    _Var5._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_sentinel;
    if (bVar2) {
      if (gtest_sentinel.test_ == (DeathTest *)0x0) {
        return;
      }
      iVar3 = (*(gtest_sentinel.test_)->_vptr_DeathTest[2])(gtest_sentinel.test_);
      if (iVar3 == 0) {
        iVar3 = (*(gtest_sentinel.test_)->_vptr_DeathTest[3])(gtest_sentinel.test_);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*(gtest_sentinel.test_)->_vptr_DeathTest[4])(gtest_sentinel.test_,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (*((DeathTest *)_Var5._M_head_impl)->_vptr_DeathTest[1])(_Var5._M_head_impl);
          goto LAB_0010ca75;
        }
      }
      else if (iVar3 == 1) {
        local_40 = (ReturnSentinel)(ReturnSentinel)gtest_sentinel.test_;
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          operator_delete(_Var1._M_head_impl,4);
        }
        (*(gtest_sentinel.test_)->_vptr_DeathTest[5])(gtest_sentinel.test_,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_40);
      }
      DVar4 = (DeathTest)((DeathTest *)_Var5._M_head_impl)->_vptr_DeathTest;
      goto LAB_0010cac0;
    }
  }
LAB_0010ca75:
  testing::Message::Message((Message *)local_60);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
             ,0x83,message);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)local_60);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
  if (local_60[0]._M_head_impl ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
  DVar4._vptr_DeathTest = *(_func_int ***)local_60[0]._M_head_impl;
  _Var5._M_head_impl = local_60[0]._M_head_impl;
LAB_0010cac0:
  (*DVar4._vptr_DeathTest[1])(_Var5._M_head_impl);
  return;
}

Assistant:

TEST(DebugAllocationTest, StompAfter) {
  int* pint = noopt(new int);
  (void)pint;
  pint[1] = 5;
  EXPECT_DEATH(delete pint, "a word after object");
}